

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

void sznet::sz_sleep(int millisec)

{
  undefined1 local_20 [8];
  timespec ts;
  int millisec_local;
  
  ts.tv_nsec._4_4_ = millisec;
  memset(local_20,0,0x10);
  local_20 = (undefined1  [8])(long)(ts.tv_nsec._4_4_ / 1000);
  ts.tv_sec = (__time_t)((ts.tv_nsec._4_4_ % 1000) * 1000000);
  nanosleep((timespec *)local_20,(timespec *)0x0);
  return;
}

Assistant:

void sz_sleep(int millisec)
{
#if SZ_OS_LINUX
	struct timespec ts {};
	ts.tv_sec = millisec / 1000;
	ts.tv_nsec = (millisec % 1000) * 1000000;
	nanosleep(&ts, nullptr);
#else
	Sleep(millisec);
#endif
}